

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_chr
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  uint uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  ulong uVar4;
  
  pbVar2 = (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  uVar1 = this->abs_value;
  sVar3 = pbVar2->size_;
  uVar4 = sVar3 + 1;
  if (pbVar2->capacity_ < uVar4) {
    (**pbVar2->_vptr_buffer)(pbVar2);
    sVar3 = pbVar2->size_;
    uVar4 = sVar3 + 1;
  }
  pbVar2->size_ = uVar4;
  pbVar2->ptr_[sVar3] = (char)uVar1;
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }